

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

optional<signed_char>
trial::dynamic::convert::
overloader<boost::optional<signed_char>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
::into(basic_variable<std::allocator<char>_> *data,error_code *error)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  error_category *peVar4;
  ushort uVar5;
  
  peVar4 = (error_category *)std::_V2::system_category();
  error->_M_value = 0;
  error->_M_cat = peVar4;
  bVar1 = detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<trial::dynamic::nullable>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)data);
  if (!bVar1) {
    bVar1 = detail::
            small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
            ::
            call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<signed_char>,bool>
                      ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                        *)data);
    if (bVar1) {
      bVar2 = detail::
              overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_signed_char,_void>::
              convert(data,error);
      uVar5 = (ushort)bVar2 << 8;
      uVar3 = 1;
      goto LAB_001109c7;
    }
    if (error_category()::instance == '\0') {
      overloader<boost::optional<signed_char>,trial::dynamic::basic_variable<std::allocator<char>>,void>
      ::into();
    }
    error->_M_value = 1;
    error->_M_cat = (error_category *)&error_category()::instance;
  }
  uVar3 = 0;
  uVar5 = 0;
LAB_001109c7:
  return (type)(uVar3 | uVar5);
}

Assistant:

static boost::optional<T> into(const basic_variable<Allocator>& data,
                                   std::error_code& error)
    {
        error.clear();

        if (data.template is<nullable>())
            return boost::none;

        if (data.template is<T>())
            return data.template value<T>(error);

        error = dynamic::make_error_code(incompatible_type);
        return {};
    }